

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O0

int ecp_normalize_jac_many(mbedtls_ecp_group *grp,mbedtls_ecp_point **T,size_t t_len)

{
  mbedtls_mpi *X;
  undefined1 local_88 [8];
  mbedtls_mpi ZZi;
  mbedtls_mpi Zi;
  mbedtls_mpi u;
  mbedtls_mpi *c;
  size_t i;
  int ret;
  size_t t_len_local;
  mbedtls_ecp_point **T_local;
  mbedtls_ecp_group *grp_local;
  
  if (t_len < 2) {
    grp_local._4_4_ = ecp_normalize_jac(grp,*T);
  }
  else {
    X = (mbedtls_mpi *)calloc(t_len,0x18);
    if (X == (mbedtls_mpi *)0x0) {
      grp_local._4_4_ = -0x4d80;
    }
    else {
      mbedtls_mpi_init((mbedtls_mpi *)&Zi.p);
      mbedtls_mpi_init((mbedtls_mpi *)&ZZi.p);
      mbedtls_mpi_init((mbedtls_mpi *)local_88);
      i._4_4_ = mbedtls_mpi_copy(X,&(*T)->Z);
      if (i._4_4_ == 0) {
        for (c = (mbedtls_mpi *)0x1; c < t_len; c = (mbedtls_mpi *)((long)&c->s + 1)) {
          i._4_4_ = mbedtls_mpi_mul_mpi(X + (long)c,X + (long)((long)&c[-1].p + 7),&T[(long)c]->Z);
          if ((i._4_4_ != 0) || (i._4_4_ = ecp_modp(X + (long)c,grp), i._4_4_ != 0))
          goto LAB_0019f153;
          mul_count = mul_count + 1;
        }
        i._4_4_ = mbedtls_mpi_inv_mod((mbedtls_mpi *)&Zi.p,X + (t_len - 1),&grp->P);
        if (i._4_4_ == 0) {
          c = (mbedtls_mpi *)(t_len - 1);
          do {
            if (c == (mbedtls_mpi *)0x0) {
              i._4_4_ = mbedtls_mpi_copy((mbedtls_mpi *)&ZZi.p,(mbedtls_mpi *)&Zi.p);
              if (i._4_4_ != 0) break;
            }
            else {
              i._4_4_ = mbedtls_mpi_mul_mpi((mbedtls_mpi *)&ZZi.p,(mbedtls_mpi *)&Zi.p,
                                            X + (long)((long)&c[-1].p + 7));
              if ((i._4_4_ != 0) || (i._4_4_ = ecp_modp((mbedtls_mpi *)&ZZi.p,grp), i._4_4_ != 0))
              break;
              mul_count = mul_count + 1;
              i._4_4_ = mbedtls_mpi_mul_mpi((mbedtls_mpi *)&Zi.p,(mbedtls_mpi *)&Zi.p,&T[(long)c]->Z
                                           );
              if ((i._4_4_ != 0) || (i._4_4_ = ecp_modp((mbedtls_mpi *)&Zi.p,grp), i._4_4_ != 0))
              break;
              mul_count = mul_count + 1;
            }
            i._4_4_ = mbedtls_mpi_mul_mpi((mbedtls_mpi *)local_88,(mbedtls_mpi *)&ZZi.p,
                                          (mbedtls_mpi *)&ZZi.p);
            if ((i._4_4_ != 0) || (i._4_4_ = ecp_modp((mbedtls_mpi *)local_88,grp), i._4_4_ != 0))
            break;
            mul_count = mul_count + 1;
            i._4_4_ = mbedtls_mpi_mul_mpi(&T[(long)c]->X,&T[(long)c]->X,(mbedtls_mpi *)local_88);
            if ((i._4_4_ != 0) || (i._4_4_ = ecp_modp(&T[(long)c]->X,grp), i._4_4_ != 0)) break;
            mul_count = mul_count + 1;
            i._4_4_ = mbedtls_mpi_mul_mpi(&T[(long)c]->Y,&T[(long)c]->Y,(mbedtls_mpi *)local_88);
            if ((i._4_4_ != 0) || (i._4_4_ = ecp_modp(&T[(long)c]->Y,grp), i._4_4_ != 0)) break;
            mul_count = mul_count + 1;
            i._4_4_ = mbedtls_mpi_mul_mpi(&T[(long)c]->Y,&T[(long)c]->Y,(mbedtls_mpi *)&ZZi.p);
            if ((i._4_4_ != 0) || (i._4_4_ = ecp_modp(&T[(long)c]->Y,grp), i._4_4_ != 0)) break;
            mul_count = mul_count + 1;
            i._4_4_ = mbedtls_mpi_shrink(&T[(long)c]->X,(grp->P).n);
            if (((i._4_4_ != 0) ||
                (i._4_4_ = mbedtls_mpi_shrink(&T[(long)c]->Y,(grp->P).n), i._4_4_ != 0)) ||
               (mbedtls_mpi_free(&T[(long)c]->Z), c == (mbedtls_mpi *)0x0)) break;
            c = (mbedtls_mpi *)((long)&c[-1].p + 7);
          } while( true );
        }
      }
LAB_0019f153:
      mbedtls_mpi_free((mbedtls_mpi *)&Zi.p);
      mbedtls_mpi_free((mbedtls_mpi *)&ZZi.p);
      mbedtls_mpi_free((mbedtls_mpi *)local_88);
      for (c = (mbedtls_mpi *)0x0; c < t_len; c = (mbedtls_mpi *)((long)&c->s + 1)) {
        mbedtls_mpi_free(X + (long)c);
      }
      free(X);
      grp_local._4_4_ = i._4_4_;
    }
  }
  return grp_local._4_4_;
}

Assistant:

static int ecp_normalize_jac_many( const mbedtls_ecp_group *grp,
                                   mbedtls_ecp_point *T[], size_t t_len )
{
    int ret;
    size_t i;
    mbedtls_mpi *c, u, Zi, ZZi;

    if( t_len < 2 )
        return( ecp_normalize_jac( grp, *T ) );

    if( ( c = mbedtls_calloc( t_len, sizeof( mbedtls_mpi ) ) ) == NULL )
        return( MBEDTLS_ERR_ECP_ALLOC_FAILED );

    mbedtls_mpi_init( &u ); mbedtls_mpi_init( &Zi ); mbedtls_mpi_init( &ZZi );

    /*
     * c[i] = Z_0 * ... * Z_i
     */
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &c[0], &T[0]->Z ) );
    for( i = 1; i < t_len; i++ )
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &c[i], &c[i-1], &T[i]->Z ) );
        MOD_MUL( c[i] );
    }

    /*
     * u = 1 / (Z_0 * ... * Z_n) mod P
     */
    MBEDTLS_MPI_CHK( mbedtls_mpi_inv_mod( &u, &c[t_len-1], &grp->P ) );

    for( i = t_len - 1; ; i-- )
    {
        /*
         * Zi = 1 / Z_i mod p
         * u = 1 / (Z_0 * ... * Z_i) mod P
         */
        if( i == 0 ) {
            MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &Zi, &u ) );
        }
        else
        {
            MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &Zi, &u, &c[i-1]  ) ); MOD_MUL( Zi );
            MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &u,  &u, &T[i]->Z ) ); MOD_MUL( u );
        }

        /*
         * proceed as in normalize()
         */
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &ZZi,     &Zi,      &Zi  ) ); MOD_MUL( ZZi );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &T[i]->X, &T[i]->X, &ZZi ) ); MOD_MUL( T[i]->X );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &T[i]->Y, &T[i]->Y, &ZZi ) ); MOD_MUL( T[i]->Y );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &T[i]->Y, &T[i]->Y, &Zi  ) ); MOD_MUL( T[i]->Y );

        /*
         * Post-precessing: reclaim some memory by shrinking coordinates
         * - not storing Z (always 1)
         * - shrinking other coordinates, but still keeping the same number of
         *   limbs as P, as otherwise it will too likely be regrown too fast.
         */
        MBEDTLS_MPI_CHK( mbedtls_mpi_shrink( &T[i]->X, grp->P.n ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_shrink( &T[i]->Y, grp->P.n ) );
        mbedtls_mpi_free( &T[i]->Z );

        if( i == 0 )
            break;
    }

cleanup:

    mbedtls_mpi_free( &u ); mbedtls_mpi_free( &Zi ); mbedtls_mpi_free( &ZZi );
    for( i = 0; i < t_len; i++ )
        mbedtls_mpi_free( &c[i] );
    mbedtls_free( c );

    return( ret );
}